

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O1

ssize_t __thiscall Pl_StdioFile::write(Pl_StdioFile *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  size_t in_RAX;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined4 in_register_00000034;
  void *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  __ptr = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    do {
      in_RAX = fwrite(__ptr,1,(size_t)__buf,
                      (FILE *)((this->m)._M_t.
                               super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                               .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl)
                              ->file);
      if (in_RAX == 0) {
        pcVar1 = (this->super_Pipeline).identifier._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,
                   pcVar1 + (this->super_Pipeline).identifier._M_string_length);
        std::__cxx11::string::append((char *)&local_50);
        QUtil::throw_system_error(&local_50);
        in_RAX = extraout_RAX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          in_RAX = extraout_RAX_00;
        }
      }
      else {
        __ptr = (void *)((long)__ptr + in_RAX);
        __buf = (void *)((long)__buf - in_RAX);
      }
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

void
Pl_StdioFile::write(unsigned char const* buf, size_t len)
{
    size_t so_far = 0;
    while (len > 0) {
        so_far = fwrite(buf, 1, len, m->file);
        if (so_far == 0) {
            QUtil::throw_system_error(this->identifier + ": Pl_StdioFile::write");
        } else {
            buf += so_far;
            len -= so_far;
        }
    }
}